

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RTMath.cpp
# Opt level: O1

void RTMath::convertToVector(uchar *rawData,RTVector3 *vec,RTFLOAT scale,bool bigEndian)

{
  long lVar1;
  long lVar2;
  undefined7 in_register_00000011;
  long lVar3;
  long lVar4;
  uchar *puVar5;
  uchar *puVar6;
  
  if ((int)CONCAT71(in_register_00000011,bigEndian) == 0) {
    puVar6 = rawData + 1;
    lVar1 = 4;
    lVar2 = 5;
    lVar3 = 2;
    lVar4 = 3;
    puVar5 = rawData;
  }
  else {
    lVar1 = 5;
    lVar2 = 4;
    lVar3 = 3;
    lVar4 = 2;
    puVar5 = rawData + 1;
    puVar6 = rawData;
  }
  vec->m_data[0] = (float)(int)CONCAT11(*puVar6,*puVar5) * scale;
  vec->m_data[1] = (float)(int)CONCAT11(rawData[lVar4],rawData[lVar3]) * scale;
  vec->m_data[2] = (float)(int)CONCAT11(rawData[lVar2],rawData[lVar1]) * scale;
  return;
}

Assistant:

void RTMath::convertToVector(unsigned char *rawData, RTVector3& vec, RTFLOAT scale, bool bigEndian)
{
    if (bigEndian) {
        vec.setX((RTFLOAT)((int16_t)(((uint16_t)rawData[0] << 8) | (uint16_t)rawData[1])) * scale);
        vec.setY((RTFLOAT)((int16_t)(((uint16_t)rawData[2] << 8) | (uint16_t)rawData[3])) * scale);
        vec.setZ((RTFLOAT)((int16_t)(((uint16_t)rawData[4] << 8) | (uint16_t)rawData[5])) * scale);
    } else {
        vec.setX((RTFLOAT)((int16_t)(((uint16_t)rawData[1] << 8) | (uint16_t)rawData[0])) * scale);
        vec.setY((RTFLOAT)((int16_t)(((uint16_t)rawData[3] << 8) | (uint16_t)rawData[2])) * scale);
        vec.setZ((RTFLOAT)((int16_t)(((uint16_t)rawData[5] << 8) | (uint16_t)rawData[4])) * scale);
     }
}